

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  ID id;
  StorageClass SVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIRVariable *pSVar5;
  MSLConstexprSampler *pMVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  Resource *this_01;
  size_t sVar9;
  SPIRType *pSVar10;
  mapped_type *pmVar11;
  SPIRVariable *pSVar12;
  SPIRType *pSVar13;
  char *pcVar14;
  CompilerError *pCVar15;
  Resource *pRVar16;
  uint *ts_1;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var17;
  Resource *pRVar18;
  ulong uVar19;
  MSLConstexprSampler *pMVar20;
  TypedID<(spirv_cross::Types)0> *pTVar21;
  Resource *pRVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint *in_R9;
  long lVar23;
  long lVar24;
  uint __val;
  size_type sVar25;
  pointer pcVar26;
  byte bVar27;
  uint32_t var_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  SPIRType *local_3b0;
  string primary_name;
  string local_360;
  SmallVector<unsigned_int,_8UL> *local_340;
  MSLConstexprSampler *local_338;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_330;
  ParsedIR *local_328;
  TypedID<(spirv_cross::Types)0> *local_320;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_318;
  string local_310;
  SmallVector<unsigned_int,_8UL> *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  SmallVector<Resource,_8UL> resources;
  
  bVar27 = 0;
  resources.super_VectorView<Resource>.ptr = (Resource *)&resources.stack_storage;
  resources.super_VectorView<Resource>.buffer_size = 0;
  resources.buffer_capacity = 8;
  local_328 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_328);
  pTVar21 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  p_Var17 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)(pTVar21 +
               (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
  local_340 = (SmallVector<unsigned_int,_8UL> *)&this->constexpr_samplers_by_id;
  local_318 = &(this->atomic_image_vars)._M_h;
  local_330 = p_Var17;
  for (; (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          *)pTVar21 != p_Var17; pTVar21 = pTVar21 + 1) {
    id.id = pTVar21->id;
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id.id].type == TypeVariable) {
      local_320 = pTVar21;
      pSVar5 = ParsedIR::get<spirv_cross::SPIRVariable>(local_328,id.id);
      p_Var17 = local_330;
      pTVar21 = local_320;
      local_3d0._M_dataplus._M_p._0_4_ = id.id;
      if (((pSVar5->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
          ((0x1205U >> (pSVar5->storage & 0x1f) & 1) != 0)) &&
         (bVar2 = Compiler::is_hidden_variable((Compiler *)this,pSVar5,false), p_Var17 = local_330,
         pTVar21 = local_320, !bVar2)) {
        local_3b0 = Compiler::get_variable_data_type((Compiler *)this,pSVar5);
        bVar2 = is_supported_argument_buffer_type(this,local_3b0);
        SVar1 = pSVar5->storage;
        if (SVar1 != StorageClassPushConstant && bVar2) {
          uVar3 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
          if (((uVar3 < 8) && ((this->msl_options).argument_buffers != false)) &&
             (p_Var17 = local_330, pTVar21 = local_320,
             (this->argument_buffer_discrete_mask >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00320bb3;
          SVar1 = pSVar5->storage;
        }
        pRVar18 = resources.super_VectorView<Resource>.ptr;
        if ((SVar1 == StorageClassStorageBuffer) || (SVar1 == StorageClassUniform)) {
          lVar24 = resources.super_VectorView<Resource>.buffer_size << 6;
          for (lVar23 = 0; lVar24 != lVar23; lVar23 = lVar23 + 0x40) {
            uVar3 = Compiler::get_decoration
                              ((Compiler *)this,
                               (ID)*(uint32_t *)(*(long *)((long)&pRVar18->var + lVar23) + 8),
                               DecorationDescriptorSet);
            uVar4 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
            if (uVar3 == uVar4) {
              uVar3 = Compiler::get_decoration
                                ((Compiler *)this,
                                 (ID)*(uint32_t *)(*(long *)((long)&pRVar18->var + lVar23) + 8),
                                 DecorationBinding);
              uVar4 = Compiler::get_decoration((Compiler *)this,id,DecorationBinding);
              if (((uVar3 == uVar4) && (*(int *)((long)&pRVar18->basetype + lVar23) == 0xf)) &&
                 (*(int *)&(local_3b0->super_IVariant).field_0xc == 0xf)) {
                sVar25 = *(size_type *)((long)&pRVar18->var + lVar23);
                if ((*(int *)(sVar25 + 0x10) == 0xc) || (*(int *)(sVar25 + 0x10) == 2)) {
                  if ((local_3b0->array).super_VectorView<unsigned_int>.buffer_size != 0) {
                    pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::string::string
                              ((string *)&primary_name,
                               "Aliasing arrayed discrete descriptors is currently not supported.",
                               (allocator *)&local_360);
                    CompilerError::CompilerError(pCVar15,&primary_name);
                    __cxa_throw(pCVar15,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  *(size_type *)((long)&pRVar18->descriptor_alias + lVar23) = sVar25;
                  sVar8 = ::std::
                          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          ::count(&this_00->_M_h,(key_type *)&local_3d0);
                  if (sVar8 != 0) {
                    primary_name._M_dataplus._M_p._0_4_ =
                         *(undefined4 *)(*(long *)((long)&pRVar18->var + lVar23) + 8);
                    ::std::__detail::
                    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                              *)this_00,(value_type *)&primary_name);
                  }
                  goto LAB_0032090c;
                }
              }
            }
          }
          sVar25 = 0;
        }
        else {
          sVar25 = 0;
        }
LAB_0032090c:
        if (*(int *)&(local_3b0->super_IVariant).field_0xc - 0x11U < 2) {
          pMVar6 = find_constexpr_sampler(this,local_3d0._M_dataplus._M_p._0_4_);
          if (pMVar6 == (MSLConstexprSampler *)0x0) {
            pMVar6 = (MSLConstexprSampler *)0x0;
          }
          else {
            pmVar7 = ::std::
                     map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                     ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                   *)local_340,(key_type *)&local_3d0);
            pMVar20 = pMVar6;
            for (lVar23 = 0x19; lVar23 != 0; lVar23 = lVar23 + -1) {
              pmVar7->coord = pMVar20->coord;
              pMVar20 = (MSLConstexprSampler *)((long)pMVar20 + (ulong)bVar27 * -8 + 4);
              pmVar7 = (mapped_type *)((long)pmVar7 + (ulong)bVar27 * -8 + 4);
            }
          }
        }
        else {
          pMVar6 = (MSLConstexprSampler *)0x0;
        }
        primary_name._M_dataplus._M_p._0_4_ = (pSVar5->super_IVariant).self.id;
        sVar8 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(local_318,(key_type *)&primary_name);
        if (sVar8 != 0) {
          get_metal_resource_index(this,pSVar5,AtomicCounter,0);
        }
        if (*(int *)&(local_3b0->super_IVariant).field_0xc == 0x11) {
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,local_3d0._M_dataplus._M_p._0_4_);
          uVar3 = 1;
          if ((pMVar6 != (MSLConstexprSampler *)0x0) && (pMVar6->ycbcr_conversion_enable == true)) {
            uVar3 = pMVar6->planes;
          }
          local_338 = pMVar6;
          for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            primary_name._M_dataplus._M_p = (pointer)pSVar5;
            primary_name._M_string_length = sVar25;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&primary_name.field_2,this,(ulong)local_3d0._M_dataplus._M_p._0_4_,1);
            get_metal_resource_index(this,pSVar5,Image,uVar4);
            SmallVector<Resource,_8UL>::push_back(&resources,(Resource *)&primary_name);
            ::std::__cxx11::string::~string((string *)primary_name.field_2._M_local_buf);
          }
          p_Var17 = local_330;
          pTVar21 = local_320;
          if ((local_338 == (MSLConstexprSampler *)0x0) && ((local_3b0->image).dim != DimBuffer)) {
            primary_name._M_dataplus._M_p = (pointer)pSVar5;
            primary_name._M_string_length = sVar25;
            to_sampler_expression_abi_cxx11_
                      ((string *)&primary_name.field_2,this,local_3d0._M_dataplus._M_p._0_4_);
            get_metal_resource_index(this,pSVar5,Sampler,0);
            SmallVector<Resource,_8UL>::push_back(&resources,(Resource *)&primary_name);
            ::std::__cxx11::string::~string((string *)primary_name.field_2._M_local_buf);
            p_Var17 = local_330;
            pTVar21 = local_320;
          }
        }
        else {
          p_Var17 = local_330;
          pTVar21 = local_320;
          if (pMVar6 == (MSLConstexprSampler *)0x0) {
            CompilerGLSL::add_resource_name
                      (&this->super_CompilerGLSL,local_3d0._M_dataplus._M_p._0_4_);
            if (sVar25 == 0) {
              get_metal_resource_index
                        (this,pSVar5,*(BaseType *)&(local_3b0->super_IVariant).field_0xc,0);
            }
            primary_name._M_dataplus._M_p = (pointer)pSVar5;
            primary_name._M_string_length = sVar25;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&primary_name.field_2,this,(ulong)local_3d0._M_dataplus._M_p._0_4_,1);
            SmallVector<Resource,_8UL>::push_back(&resources,(Resource *)&primary_name);
            ::std::__cxx11::string::~string((string *)primary_name.field_2._M_local_buf);
            p_Var17 = local_330;
            pTVar21 = local_320;
          }
        }
      }
    }
LAB_00320bb3:
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_3f0);
  pRVar18 = resources.super_VectorView<Resource>.ptr;
  if (resources.super_VectorView<Resource>.buffer_size == 0) {
    sVar9 = 0;
  }
  else {
    pRVar16 = resources.super_VectorView<Resource>.ptr +
              resources.super_VectorView<Resource>.buffer_size;
    primary_name._M_dataplus._M_p =
         (pointer)((long)(resources.super_VectorView<Resource>.buffer_size + 1) / 2);
    primary_name._M_string_length = 0;
    primary_name.field_2._M_allocated_capacity = 0;
    pcVar26 = primary_name._M_dataplus._M_p;
LAB_00320c64:
    if ((long)pcVar26 < 1) {
      ::std::
      __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (pRVar18,pRVar16);
    }
    else {
      uVar19 = (long)pcVar26 << 6;
      this_01 = (Resource *)operator_new(uVar19,(nothrow_t *)&::std::nothrow);
      if (this_01 == (Resource *)0x0) goto code_r0x00320c80;
      entry_point_args_discrete_descriptors::Resource::Resource(this_01,pRVar18);
      pRVar22 = this_01;
      while (uVar19 = uVar19 - 0x40, uVar19 != 0) {
        entry_point_args_discrete_descriptors::Resource::Resource(pRVar22 + 1,pRVar22);
        pRVar22 = pRVar22 + 1;
      }
      entry_point_args_discrete_descriptors::Resource::operator=(pRVar18,pRVar22);
      primary_name._M_string_length = (size_type)pcVar26;
      primary_name.field_2._M_allocated_capacity = (size_type)this_01;
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (pRVar18,pRVar16,this_01,pcVar26);
    }
    ::std::_Temporary_buffer<Resource_*,_Resource>::~_Temporary_buffer
              ((_Temporary_buffer<Resource_*,_Resource> *)&primary_name);
    sVar9 = resources.super_VectorView<Resource>.buffer_size;
  }
  local_3b0 = (SPIRType *)(resources.super_VectorView<Resource>.ptr + sVar9);
  local_338 = (MSLConstexprSampler *)&this->plane_name_suffix;
  local_330 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
  local_340 = &this->buffer_aliases_discrete;
  local_2f0 = &this->buffer_arrays_discrete;
  pRVar18 = resources.super_VectorView<Resource>.ptr;
  do {
    if ((SPIRType *)pRVar18 == local_3b0) {
      SmallVector<Resource,_8UL>::~SmallVector(&resources);
      return;
    }
    pSVar5 = pRVar18->var;
    pSVar10 = Compiler::get_variable_data_type((Compiler *)this,pSVar5);
    var_id = (pSVar5->super_IVariant).self.id;
    switch(pRVar18->basetype) {
    case Struct:
      pmVar11 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_330,&(pSVar10->super_IVariant).self);
      if ((pmVar11->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
        if (pRVar18->descriptor_alias == (SPIRVariable *)0x0) {
          sVar9 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
          if (sVar9 == 0) {
            if (ep_args->_M_string_length != 0) {
              ::std::__cxx11::string::append((char *)ep_args);
            }
            get_argument_address_space_abi_cxx11_(&local_2c8,this,pSVar5);
            ::std::operator+(&local_310,&local_2c8," ");
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_2e8,this,pSVar10,0);
            ::std::operator+(&local_360,&local_310,&local_2e8);
            ::std::operator+(&local_3d0,&local_360,"& ");
            pcVar14 = to_restrict(this,var_id,true);
            ::std::operator+(&local_3f0,&local_3d0,pcVar14);
            ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
            ::std::__cxx11::string::append((string *)ep_args);
            ::std::__cxx11::string::~string((string *)&primary_name);
            ::std::__cxx11::string::~string((string *)&local_3f0);
            ::std::__cxx11::string::~string((string *)&local_3d0);
            ::std::__cxx11::string::~string((string *)&local_360);
            ::std::__cxx11::string::~string((string *)&local_2e8);
            ::std::__cxx11::string::~string((string *)&local_310);
            ::std::__cxx11::string::~string((string *)&local_2c8);
            convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
            ::std::operator+(&local_3f0," [[buffer(",&local_3d0);
            ::std::operator+(&primary_name,&local_3f0,")");
            ::std::__cxx11::string::append((string *)ep_args);
            ::std::__cxx11::string::~string((string *)&primary_name);
            ::std::__cxx11::string::~string((string *)&local_3f0);
            ::std::__cxx11::string::~string((string *)&local_3d0);
            sVar8 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&this_00->_M_h,&var_id);
            if (sVar8 != 0) {
              ::std::__cxx11::string::append((char *)ep_args);
            }
            ::std::__cxx11::string::append((char *)ep_args);
          }
          else {
            if (sVar9 != 1) {
              pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&primary_name,"Arrays of arrays of buffers are not supported.",
                         (allocator *)&local_3f0);
              CompilerError::CompilerError(pCVar15,&primary_name);
              __cxa_throw(pCVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar10);
            local_320 = (TypedID<(spirv_cross::Types)0> *)CONCAT44(local_320._4_4_,uVar3);
            if (uVar3 == 0) {
              pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&primary_name,
                         "Unsized arrays of buffers are not supported in MSL.",
                         (allocator *)&local_3f0);
              CompilerError::CompilerError(pCVar15,&primary_name);
              __cxa_throw(pCVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            this->is_using_builtin_array = true;
            SmallVector<unsigned_int,_8UL>::push_back(local_2f0,&var_id);
            local_328 = (ParsedIR *)&pRVar18->name;
            for (__val = 0; (uint)local_320 != __val; __val = __val + 1) {
              if (ep_args->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)ep_args);
              }
              get_argument_address_space_abi_cxx11_(&local_268,this,pSVar5);
              ::std::operator+(&local_2e8,&local_268," ");
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_288,this,pSVar10,0);
              ::std::operator+(&local_2c8,&local_2e8,&local_288);
              ::std::operator+(&local_310,&local_2c8,"* ");
              pcVar14 = to_restrict(this,var_id,true);
              ::std::operator+(&local_360,&local_310,pcVar14);
              ::std::operator+(&local_3d0,&local_360,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_328);
              ::std::operator+(&local_3f0,&local_3d0,"_");
              ::std::__cxx11::to_string(&local_2a8,__val);
              ::std::operator+(&primary_name,&local_3f0,&local_2a8);
              ::std::__cxx11::string::append((string *)ep_args);
              ::std::__cxx11::string::~string((string *)&primary_name);
              ::std::__cxx11::string::~string((string *)&local_2a8);
              ::std::__cxx11::string::~string((string *)&local_3f0);
              ::std::__cxx11::string::~string((string *)&local_3d0);
              ::std::__cxx11::string::~string((string *)&local_360);
              ::std::__cxx11::string::~string((string *)&local_310);
              ::std::__cxx11::string::~string((string *)&local_2c8);
              ::std::__cxx11::string::~string((string *)&local_288);
              ::std::__cxx11::string::~string((string *)&local_2e8);
              ::std::__cxx11::string::~string((string *)&local_268);
              ::std::__cxx11::to_string(&local_3d0,pRVar18->index + __val);
              ::std::operator+(&local_3f0," [[buffer(",&local_3d0);
              ::std::operator+(&primary_name,&local_3f0,")");
              ::std::__cxx11::string::append((string *)ep_args);
              ::std::__cxx11::string::~string((string *)&primary_name);
              ::std::__cxx11::string::~string((string *)&local_3f0);
              ::std::__cxx11::string::~string((string *)&local_3d0);
              sVar8 = ::std::
                      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count(&this_00->_M_h,&var_id);
              if (sVar8 != 0) {
                ::std::__cxx11::string::append((char *)ep_args);
              }
              ::std::__cxx11::string::append((char *)ep_args);
            }
            this->is_using_builtin_array = false;
          }
        }
        else {
          pSVar12 = pRVar18->var;
          if (pSVar12 == pRVar18->descriptor_alias) {
            local_3f0._M_dataplus._M_p._0_4_ =
                 Compiler::get_decoration((Compiler *)this,(ID)var_id,DecorationDescriptorSet);
            local_3d0._M_dataplus._M_p._0_4_ =
                 Compiler::get_decoration((Compiler *)this,var_id,DecorationBinding);
            join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                      (&primary_name,(spirv_cross *)"spvBufferAliasSet",(char (*) [18])&local_3f0,
                       (uint *)"Binding",(char (*) [8])&local_3d0,in_R9);
            if (ep_args->_M_string_length != 0) {
              ::std::__cxx11::string::append((char *)ep_args);
            }
            get_argument_address_space_abi_cxx11_(&local_360,this,pSVar5);
            ::std::operator+(&local_3d0,&local_360," void* ");
            ::std::operator+(&local_3f0,&local_3d0,&primary_name);
            ::std::__cxx11::string::append((string *)ep_args);
            ::std::__cxx11::string::~string((string *)&local_3f0);
            ::std::__cxx11::string::~string((string *)&local_3d0);
            ::std::__cxx11::string::~string((string *)&local_360);
            convert_to_string<unsigned_int,_0>(&local_360,&pRVar18->index);
            ::std::operator+(&local_3d0," [[buffer(",&local_360);
            ::std::operator+(&local_3f0,&local_3d0,")");
            ::std::__cxx11::string::append((string *)ep_args);
            ::std::__cxx11::string::~string((string *)&local_3f0);
            ::std::__cxx11::string::~string((string *)&local_3d0);
            ::std::__cxx11::string::~string((string *)&local_360);
            sVar8 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&this_00->_M_h,&var_id);
            if (sVar8 != 0) {
              ::std::__cxx11::string::append((char *)ep_args);
            }
            ::std::__cxx11::string::append((char *)ep_args);
            ::std::__cxx11::string::~string((string *)&primary_name);
            pSVar12 = pRVar18->var;
          }
          primary_name._M_dataplus._M_p._0_4_ = (pSVar12->super_IVariant).self.id;
          SmallVector<unsigned_int,_8UL>::push_back(local_340,(uint *)&primary_name);
        }
      }
      break;
    case Image:
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar13 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,*(uint32_t *)&(pSVar5->super_IVariant).field_0xc);
      if (((*(int *)&(pSVar13->super_IVariant).field_0xc == 0x10) &&
          ((pSVar13->image).dim == DimSubpassData)) &&
         ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
        if (((this->msl_options).platform == macOS) && ((this->msl_options).msl_version < 0x4f4c)) {
          pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&primary_name,
                     "Framebuffer fetch on Mac is not supported before MSL 2.3.",
                     (allocator *)&local_3f0);
          CompilerError::CompilerError(pCVar15,&primary_name);
          __cxa_throw(pCVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (&local_3d0,this,pSVar10,(ulong)var_id);
        ::std::operator+(&local_3f0,&local_3d0," ");
        ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
        ::std::operator+(&local_3f0," [[color(",&local_3d0);
        ::std::operator+(&primary_name,&local_3f0,")]]");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
      }
      else {
        ts_1 = (uint *)(ulong)var_id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])(&local_3d0,this,pSVar10);
        ::std::operator+(&local_3f0,&local_3d0," ");
        ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        if (pRVar18->plane != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (&primary_name,(spirv_cross *)local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pRVar18->plane,ts_1);
          ::std::__cxx11::string::append((string *)ep_args);
          ::std::__cxx11::string::~string((string *)&primary_name);
        }
        convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
        ::std::operator+(&local_3f0," [[texture(",&local_3d0);
        ::std::operator+(&primary_name,&local_3f0,")");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        sVar8 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,&var_id);
        if (sVar8 != 0) {
          ::std::__cxx11::string::append((char *)ep_args);
        }
        ::std::__cxx11::string::append((char *)ep_args);
      }
      primary_name._M_dataplus._M_p._0_4_ = (pSVar5->super_IVariant).self.id;
      sVar8 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_318,(key_type *)&primary_name);
      if (sVar8 != 0) {
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar13->image).type.id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_3f0,this,pSVar10,0)
        ;
        ::std::operator+(&primary_name,", device atomic_",&local_3f0);
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::operator+(&local_3f0,"* ",&pRVar18->name);
        ::std::operator+(&primary_name,&local_3f0,"_atomic");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->secondary_index);
        ::std::operator+(&local_3f0," [[buffer(",&local_3d0);
        ::std::operator+(&primary_name,&local_3f0,")");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        sVar8 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,&var_id);
        if (sVar8 != 0) {
          ::std::__cxx11::string::append((char *)ep_args);
        }
        ::std::__cxx11::string::append((char *)ep_args);
      }
      break;
    default:
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      if (pSVar10->pointer == false) {
        pSVar13 = Compiler::get<spirv_cross::SPIRType>
                            ((Compiler *)this,*(uint32_t *)&(pSVar5->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_(&local_310,this,pSVar13,var_id,false);
        ::std::operator+(&local_360,&local_310," ");
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_2c8,this,pSVar10,(ulong)var_id);
        ::std::operator+(&local_3d0,&local_360,&local_2c8);
        ::std::operator+(&local_3f0,&local_3d0,"& ");
        ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::__cxx11::string::~string((string *)&local_2c8);
        ::std::__cxx11::string::~string((string *)&local_360);
        __lhs = &local_310;
      }
      else {
        __lhs = &local_3d0;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (__lhs,this,pSVar10,(ulong)var_id);
        ::std::operator+(&local_3f0,__lhs," ");
        ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&primary_name);
        ::std::__cxx11::string::~string((string *)&local_3f0);
      }
      ::std::__cxx11::string::~string((string *)__lhs);
      convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
      ::std::operator+(&local_3f0," [[buffer(",&local_3d0);
      ::std::operator+(&primary_name,&local_3f0,")");
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&primary_name);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      sVar8 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,&var_id);
      if (sVar8 != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      ::std::__cxx11::string::append((char *)ep_args);
      break;
    case Sampler:
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      sampler_type_abi_cxx11_(&local_3d0,this,pSVar10,var_id);
      ::std::operator+(&local_3f0,&local_3d0," ");
      ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&primary_name);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
      ::std::operator+(&local_3f0," [[sampler(",&local_3d0);
      ::std::operator+(&primary_name,&local_3f0,")]]");
      ::std::__cxx11::string::append((string *)ep_args);
      goto LAB_00321286;
    case AccelerationStructure:
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_360,this,pSVar10);
      ::std::operator+(&local_3d0,", ",&local_360);
      ::std::operator+(&local_3f0,&local_3d0," ");
      ::std::operator+(&primary_name,&local_3f0,&pRVar18->name);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&primary_name);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      ::std::__cxx11::string::~string((string *)&local_360);
      convert_to_string<unsigned_int,_0>(&local_3d0,&pRVar18->index);
      ::std::operator+(&local_3f0," [[buffer(",&local_3d0);
      ::std::operator+(&primary_name,&local_3f0,")]]");
      ::std::__cxx11::string::append((string *)ep_args);
LAB_00321286:
      ::std::__cxx11::string::~string((string *)&primary_name);
      ::std::__cxx11::string::~string((string *)&local_3f0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
    }
    pRVar18 = pRVar18 + 1;
  } while( true );
code_r0x00320c80:
  bVar2 = pcVar26 == (pointer)0x1;
  pcVar26 = (pointer)((ulong)(pcVar26 + 1) >> 1);
  if (bVar2) {
    pcVar26 = (pointer)0x0;
  }
  goto LAB_00320c64;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
				if (descriptor_set_is_argument_buffer(desc_set))
					return;
			}

			// Handle descriptor aliasing. We can handle aliasing of buffers by casting pointers,
			// but not for typed resources.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						// Possible, but horrible to implement, ignore for now.
						if (!type.array.empty())
							SPIRV_CROSS_THROW("Aliasing arrayed discrete descriptors is currently not supported.");

						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({ &var, descriptor_alias, to_name(var_id), SPIRType::Image,
					                      get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({ &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                      get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources.push_back({ &var, descriptor_alias, to_name(var_id), type.basetype,
				                      resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(), [](const Resource &lhs, const Resource &rhs) {
		return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index);
	});

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.descriptor_alias)
			{
				if (r.var == r.descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				// Metal doesn't directly support this, so we must expand the
				// array. We'll declare a local array to hold these elements
				// later.
				uint32_t array_size = to_array_size_literal(type);

				if (array_size == 0)
					SPIRV_CROSS_THROW("Unsized arrays of buffers are not supported in MSL.");

				// Allow Metal to use the array<T> template to make arrays a value type
				is_using_builtin_array = true;
				buffer_arrays_discrete.push_back(var_id);
				for (uint32_t i = 0; i < array_size; ++i)
				{
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " + to_restrict(var_id, true) +
					           r.name + "_" + convert_to_string(i);
					ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    get_argument_address_space(var) + " " + type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id) + " " + r.name;
			ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);
				ep_args += " [[texture(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars.count(var.self))
			{
				ep_args += ", device atomic_" + type_to_glsl(get<SPIRType>(basetype.image.type), 0);
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
			ep_args += ", " + type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			break;
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}